

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O2

OperatorResultType
duckdb::PhysicalUnnest::ExecuteInternal
          (ExecutionContext *context,DataChunk *input,DataChunk *chunk,OperatorState *state_p,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list,bool include_input)

{
  OperatorState *pOVar1;
  vector<duckdb::Vector,_true> *this;
  vector<unsigned_long,_true> *this_00;
  _func_int **position;
  sel_t *psVar2;
  value_type vVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference pvVar8;
  _func_int **pp_Var9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  LogicalType *this_01;
  idx_t iVar13;
  Vector *other;
  _func_int **pp_Var14;
  ulong uVar15;
  DataChunk *select_list_00;
  long lVar16;
  _func_int **pp_Var17;
  _func_int **pp_Var18;
  long lVar19;
  int iVar20;
  idx_t r_1;
  ulong uVar21;
  idx_t col_idx;
  ulong uVar22;
  ulong uVar23;
  ulong local_d0;
  LogicalType local_60;
  LogicalType local_48;
  
  pOVar1 = state_p + 1;
  this = (vector<duckdb::Vector,_true> *)(state_p + 0x1c);
  this_00 = (vector<unsigned_long,_true> *)(state_p + 0x10);
  select_list_00 = chunk;
  do {
    if (*(char *)&state_p[6]._vptr_OperatorState == '\x01') {
      UnnestOperatorState::PrepareInput
                ((UnnestOperatorState *)state_p,input,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)select_list_00);
    }
    position = pOVar1->_vptr_OperatorState;
    if ((_func_int **)input->count <= position) {
      pOVar1->_vptr_OperatorState = (_func_int **)0x0;
      state_p[2]._vptr_OperatorState = (_func_int **)0x0;
      *(undefined1 *)&state_p[6]._vptr_OperatorState = 1;
      return NEED_MORE_INPUT;
    }
    uVar22 = 0;
    while( true ) {
      pp_Var14 = state_p[0x1c]._vptr_OperatorState;
      pp_Var18 = state_p[0x1d]._vptr_OperatorState;
      if ((ulong)(((long)pp_Var18 - (long)pp_Var14) / 0x68) <= uVar22) break;
      pvVar5 = vector<unsigned_long,_true>::get<true>(this_00,uVar22);
      *pvVar5 = 0;
      uVar22 = uVar22 + 1;
    }
    local_d0 = 0;
    lVar16 = 0;
LAB_01916dbc:
    lVar19 = lVar16;
    if ((local_d0 < 0x800) &&
       (pp_Var9 = pOVar1->_vptr_OperatorState, pp_Var9 < (_func_int **)input->count)) {
      uVar22 = (long)state_p[3]._vptr_OperatorState[(long)pp_Var9] -
               (long)state_p[2]._vptr_OperatorState;
      if (0x800 - local_d0 < uVar22) {
        uVar22 = 0x800 - local_d0;
      }
      if ((_func_int **)state_p[3]._vptr_OperatorState[(long)pp_Var9] !=
          state_p[2]._vptr_OperatorState) break;
      goto LAB_01916f8a;
    }
    chunk->count = local_d0;
    if (include_input) {
      for (uVar23 = 0;
          uVar22 = ((long)(input->data).
                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x68, uVar23 < uVar22;
          uVar23 = uVar23 + 1) {
        pvVar10 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar23);
        pvVar11 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar23);
        if (lVar19 == 1) {
          ConstantVector::Reference(pvVar10,pvVar11,(idx_t)position,input->count);
        }
        else {
          Vector::Slice(pvVar10,pvVar11,(SelectionVector *)(state_p + 7),local_d0);
        }
      }
    }
    else {
      uVar22 = 0;
    }
    for (uVar23 = 0;
        lVar16 = (long)state_p[0x1d]._vptr_OperatorState - (long)state_p[0x1c]._vptr_OperatorState,
        select_list_00 = (DataChunk *)(lVar16 % 0x68), uVar23 < (ulong)(lVar16 / 0x68);
        uVar23 = uVar23 + 1) {
      pvVar10 = vector<duckdb::Vector,_true>::get<true>(this,uVar23);
      pvVar11 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar23 + uVar22);
      pvVar12 = vector<duckdb::Vector,_true>::get<true>(this,uVar23);
      LogicalType::LogicalType(&local_60,SQLNULL);
      bVar4 = LogicalType::operator==(&pvVar12->type,&local_60);
      if (bVar4) {
LAB_019170e2:
        LogicalType::~LogicalType(&local_60);
LAB_019170ec:
        Vector::SetVectorType(pvVar11,CONSTANT_VECTOR);
        ConstantVector::SetNull(pvVar11,true);
      }
      else {
        pvVar12 = vector<duckdb::Vector,_true>::get<true>(this,uVar23);
        this_01 = ListType::GetChildType(&pvVar12->type);
        LogicalType::LogicalType(&local_48,SQLNULL);
        bVar4 = LogicalType::operator==(this_01,&local_48);
        if (bVar4) {
          LogicalType::~LogicalType(&local_48);
          goto LAB_019170e2;
        }
        iVar13 = ListVector::GetListSize(pvVar10);
        LogicalType::~LogicalType(&local_48);
        LogicalType::~LogicalType(&local_60);
        if (iVar13 == 0) goto LAB_019170ec;
        other = ListVector::GetEntry(pvVar10);
        pvVar7 = vector<duckdb::SelectionVector,_true>::get<true>
                           ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),uVar23);
        Vector::Slice(pvVar11,other,pvVar7,local_d0);
        pvVar5 = vector<unsigned_long,_true>::get<true>(this_00,uVar23);
        if (*pvVar5 != 0) {
          Vector::Flatten(pvVar11,local_d0);
          pvVar7 = vector<duckdb::SelectionVector,_true>::get<true>
                             ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),uVar23);
          for (uVar21 = 0; pvVar5 = vector<unsigned_long,_true>::get<true>(this_00,uVar23),
              uVar21 < *pvVar5; uVar21 = uVar21 + 1) {
            uVar15 = uVar21;
            if (pvVar7->sel_vector != (sel_t *)0x0) {
              uVar15 = (ulong)pvVar7->sel_vector[uVar21];
            }
            FlatVector::SetNull(pvVar11,uVar15,true);
          }
        }
      }
    }
    if (chunk->count != 0) {
      return HAVE_MORE_OUTPUT;
    }
  } while( true );
  uVar23 = local_d0;
  uVar21 = uVar22;
  if (include_input) {
    while (uVar21 != 0) {
      ((SelectionVector *)(state_p + 7))->sel_vector[uVar23] = (sel_t)pp_Var9;
      uVar23 = uVar23 + 1;
      uVar21 = uVar21 - 1;
    }
  }
  for (uVar23 = 0; uVar23 < (ulong)(((long)pp_Var18 - (long)pp_Var14) / 0x68); uVar23 = uVar23 + 1)
  {
    pvVar6 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                       ((vector<duckdb::UnifiedVectorFormat,_true> *)(state_p + 0x24),uVar23);
    pp_Var14 = pOVar1->_vptr_OperatorState;
    psVar2 = pvVar6->sel->sel_vector;
    if (psVar2 != (sel_t *)0x0) {
      pp_Var14 = (_func_int **)(ulong)psVar2[(long)pp_Var14];
    }
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(pvVar6->validity).super_TemplatedValidityMask<unsigned_long>,
                       (idx_t)pp_Var14);
    if (bVar4) {
      iVar20 = (int)*(undefined8 *)(pvVar6->data + (long)pp_Var14 * 0x10);
      pp_Var14 = *(_func_int ***)(pvVar6->data + (long)pp_Var14 * 0x10 + 8);
    }
    else {
      iVar20 = 0;
      pp_Var14 = (_func_int **)0x0;
    }
    uVar21 = (long)pp_Var14 - (long)state_p[2]._vptr_OperatorState;
    if (pp_Var14 < state_p[2]._vptr_OperatorState) {
      uVar21 = 0;
    }
    if (uVar22 <= uVar21) {
      uVar21 = uVar22;
    }
    pvVar7 = vector<duckdb::SelectionVector,_true>::get<true>
                       ((vector<duckdb::SelectionVector,_true> *)(state_p + 10),uVar23);
    psVar2 = pvVar7->sel_vector;
    for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
      psVar2[local_d0 + uVar15] = iVar20 + (int)uVar15 + *(int *)&state_p[2]._vptr_OperatorState;
    }
    pvVar8 = vector<duckdb::SelectionVector,_true>::get<true>
                       ((vector<duckdb::SelectionVector,_true> *)(state_p + 0xd),uVar23);
    lVar16 = local_d0 + uVar21;
    for (; uVar21 < uVar22; uVar21 = uVar21 + 1) {
      pvVar7->sel_vector[lVar16] = 0;
      pvVar5 = vector<unsigned_long,_true>::get<true>(this_00,uVar23);
      vVar3 = *pvVar5;
      *pvVar5 = vVar3 + 1;
      pvVar8->sel_vector[vVar3] = (sel_t)lVar16;
      lVar16 = lVar16 + 1;
    }
    pp_Var14 = state_p[0x1c]._vptr_OperatorState;
    pp_Var18 = state_p[0x1d]._vptr_OperatorState;
  }
  local_d0 = local_d0 + uVar22;
  pp_Var17 = (_func_int **)(uVar22 + (long)state_p[2]._vptr_OperatorState);
  state_p[2]._vptr_OperatorState = pp_Var17;
  pp_Var9 = state_p[1]._vptr_OperatorState;
  lVar16 = lVar19 + 1;
  if (pp_Var17 == (_func_int **)state_p[3]._vptr_OperatorState[(long)pp_Var9]) {
LAB_01916f8a:
    state_p[1]._vptr_OperatorState = (_func_int **)((long)pp_Var9 + 1);
    state_p[2]._vptr_OperatorState = (_func_int **)0x0;
    lVar16 = lVar19 + 1;
  }
  goto LAB_01916dbc;
}

Assistant:

OperatorResultType PhysicalUnnest::ExecuteInternal(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p,
                                                   const vector<unique_ptr<Expression>> &select_list,
                                                   bool include_input) {

	auto &state = state_p.Cast<UnnestOperatorState>();

	do {
		// prepare the input data by executing any expressions and getting the
		// UnifiedVectorFormat of each LIST vector (list_vector_data) and its child vector (list_child_data)
		if (state.first_fetch) {
			state.PrepareInput(input, select_list);
		}

		// finished with all rows of this input chunk, reset
		if (state.current_row >= input.size()) {
			state.Reset();
			return OperatorResultType::NEED_MORE_INPUT;
		}

		// we essentially create two different SelectionVectors to slice
		// one is for the input (if include_input is set)
		// the other is for the list we are unnesting
		// construct these
		idx_t result_length = 0;
		idx_t unnest_list_count = 0;
		auto initial_row = state.current_row;
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			state.null_counts[col_idx] = 0;
		}
		while (result_length < STANDARD_VECTOR_SIZE && state.current_row < input.size()) {
			auto current_row_length = MinValue<idx_t>(STANDARD_VECTOR_SIZE - result_length,
			                                          state.unnest_lengths[state.current_row] - state.list_position);

			if (current_row_length > 0) {
				// set up the selection vectors
				if (include_input) {
					for (idx_t r = 0; r < current_row_length; r++) {
						state.input_sel.set_index(result_length + r, state.current_row);
					}
				}
				for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
					auto &vector_data = state.list_vector_data[col_idx];
					auto current_idx = vector_data.sel->get_index(state.current_row);
					idx_t list_length = 0;
					idx_t list_offset = 0;
					if (vector_data.validity.RowIsValid(current_idx)) {
						auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vector_data);
						auto list_entry = list_data[current_idx];
						list_length = list_entry.length;
						list_offset = list_entry.offset;
					}
					// unnest any entries we can
					idx_t unnest_length = MinValue<idx_t>(
					    list_length - MinValue<idx_t>(list_length, state.list_position), current_row_length);
					auto &unnest_sel = state.unnest_sels[col_idx];
					for (idx_t r = 0; r < unnest_length; r++) {
						unnest_sel.set_index(result_length + r, list_offset + state.list_position + r);
					}
					// for any remaining entries (if any) - set them in the null selection
					auto &null_sel = state.null_sels[col_idx];
					for (idx_t r = unnest_length; r < current_row_length; r++) {
						// we unnest the first row in the child list
						// this is chosen arbitrarily - we will override it with `NULL` afterwards
						// FIXME if the child list has a `NULL` entry we can directly unnest that and avoid having
						// to override it - this is a potential optimization we could do in the future
						unnest_sel.set_index(result_length + r, 0);
						null_sel.set_index(state.null_counts[col_idx]++, result_length + r);
					}
				}

				// move to the next row
				result_length += current_row_length;
				state.list_position += current_row_length;
			}
			unnest_list_count++;
			if (state.list_position == state.unnest_lengths[state.current_row]) {
				state.current_row++;
				state.list_position = 0;
			}
		}
		idx_t col_offset = 0;
		chunk.SetCardinality(result_length);
		if (include_input) {
			for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
				if (unnest_list_count == 1) {
					// everything belongs to the same row - we can do a constant reference
					ConstantVector::Reference(chunk.data[col_idx], input.data[col_idx], initial_row, input.size());
				} else {
					// input values come from different rows - we need to slice
					chunk.data[col_idx].Slice(input.data[col_idx], state.input_sel, result_length);
				}
			}
			col_offset = input.ColumnCount();
		}
		for (idx_t col_idx = 0; col_idx < state.list_data.ColumnCount(); col_idx++) {
			auto &list_vector = state.list_data.data[col_idx];
			auto &result_vector = chunk.data[col_offset + col_idx];
			if (state.list_data.data[col_idx].GetType() == LogicalType::SQLNULL ||
			    ListType::GetChildType(state.list_data.data[col_idx].GetType()) == LogicalType::SQLNULL ||
			    ListVector::GetListSize(list_vector) == 0) {
				// UNNEST(NULL) or UNNEST([])
				// we cannot slice empty lists - but if our child list is empty we can only return NULL anyway
				result_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result_vector, true);
				continue;
			}
			auto &child_vector = ListVector::GetEntry(list_vector);
			result_vector.Slice(child_vector, state.unnest_sels[col_idx], result_length);
			if (state.null_counts[col_idx] > 0) {
				// we have NULL values that we need to set - flatten
				result_vector.Flatten(result_length);
				auto &null_sel = state.null_sels[col_idx];
				for (idx_t idx = 0; idx < state.null_counts[col_idx]; idx++) {
					auto null_index = null_sel.get_index(idx);
					FlatVector::SetNull(result_vector, null_index, true);
				}
			}
		}
	} while (chunk.size() == 0);
	return OperatorResultType::HAVE_MORE_OUTPUT;
}